

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O2

void __thiscall
AbstractTxIn_WitnessStackError_Test::TestBody(AbstractTxIn_WitnessStackError_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_108;
  AssertHelper local_100;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScriptWitness local_c0;
  AbstractTxIn actual;
  
  cfd::core::AbstractTxIn::AbstractTxIn(&actual,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  std::__cxx11::string::string((string *)&gtest_ar,"0123456789",(allocator *)&sStack_108);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_,(string *)&gtest_ar);
  cfd::core::AbstractTxIn::SetScriptWitnessStack((uint)&local_c0,(ByteData *)&actual);
  cfd::core::ScriptWitness::~ScriptWitness(&local_c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  gtest_ar_.success_ = false;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::Message::Message((Message *)&sStack_108);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x32d91d,"false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_100,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstracttxin.cpp"
             ,0x77,(char *)gtest_ar._0_8_);
  testing::internal::AssertHelper::operator=(&local_100,(Message *)&sStack_108);
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_108);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn(&actual);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStackError) {
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  try {
    actual.SetScriptWitnessStack(0, ByteData("0123456789"));
  } catch (const CfdException &e) {
    EXPECT_STREQ(e.what(), "vin out_of_range error.");
    return;
  }
  ASSERT_TRUE(false);
}